

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::LookCharN
          (AsciiParser *this,size_t n,vector<char,_std::allocator<char>_> *nc)

{
  ulong uVar1;
  ssize_t sVar2;
  vector<char,_std::allocator<char>_> buf;
  allocator_type local_41;
  _Vector_base<char,_std::allocator<char>_> local_40;
  
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_40,n,&local_41);
  uVar1 = this->_sr->idx_;
  sVar2 = StreamReader::read(this->_sr,(int)n,(void *)n,
                             (size_t)local_40._M_impl.super__Vector_impl_data._M_start);
  if (sVar2 != 0) {
    ::std::vector<char,_std::allocator<char>_>::operator=
              (nc,(vector<char,_std::allocator<char>_> *)&local_40);
  }
  if (uVar1 <= this->_sr->length_) {
    this->_sr->idx_ = uVar1;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_40);
  return sVar2 != 0;
}

Assistant:

bool AsciiParser::LookCharN(size_t n, std::vector<char> *nc) {
  std::vector<char> buf(n);

  auto loc = CurrLoc();

  bool ok = _sr->read(n, n, reinterpret_cast<uint8_t *>(buf.data()));
  if (ok) {
    (*nc) = buf;
  }

  SeekTo(loc);

  return ok;
}